

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

bool __thiscall
helics::apps::Connector::makePotentialTemplateConnection
          (Connector *this,string_view interface,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList,
          vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
          *potentialTemplates,
          unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *aliases)

{
  pointer pTVar1;
  TemplateMatcher *pTVar2;
  _Base_ptr p_Var3;
  pointer pCVar4;
  TemplateMatcher *this_00;
  pointer this_01;
  string_view target;
  optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  match;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> connectionOptions;
  _Storage<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  local_118;
  char local_e8;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_e0;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> local_b0;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_98;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_68;
  
  buildPossibleConnectionList(&local_b0,this,interface,tagList);
  pCVar4 = local_b0.
           super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pCVar4 == local_b0.
                  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0023f867:
      CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::~vector
                (&local_b0);
      return pCVar4 != local_b0.
                       super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    }
    pTVar1 = (potentialTemplates->
             super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (potentialTemplates->
                   super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                   )._M_impl.super__Vector_impl_data._M_start; this_01 != pTVar1;
        this_01 = this_01 + 1) {
      TemplateMatcher::isTemplateMatch
                ((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&local_118._M_value,this_01,pCVar4->interface2);
      if (local_e8 == '\x01') {
        local_68.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len =
             local_118._M_value.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
             _M_head_impl._M_len;
        local_68.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_str =
             local_118._M_value.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
             _M_head_impl._M_str;
        local_68.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .
        super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len =
             local_118._M_value.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             .
             super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
             _M_head_impl._M_len;
        local_68.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .
        super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_str =
             local_118._M_value.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             .
             super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
             _M_head_impl._M_str;
        local_68.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .
        super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
        super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len =
             local_118._M_value.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             .
             super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
             super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
             _M_head_impl._M_len;
        local_68.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .
        super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
        super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_str =
             local_118._M_value.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             .
             super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
             super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
             _M_head_impl._M_str;
        TemplateMatcher::setAsUsed(this_01,&local_68);
        goto LAB_0023f867;
      }
    }
    target._M_str = (char *)aliases;
    target._M_len = (size_t)(pCVar4->interface2)._M_str;
    generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)&local_e0,(apps *)(pCVar4->interface2)._M_len,target,
                    (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     *)tagList);
    for (p_Var3 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &local_e0._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      pTVar2 = (potentialTemplates->
               super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = (potentialTemplates->
                     super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                     )._M_impl.super__Vector_impl_data._M_start; this_00 != pTVar2;
          this_00 = this_00 + 1) {
        TemplateMatcher::isTemplateMatch
                  ((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&local_118._M_value,this_00,*(string_view *)(p_Var3 + 1));
        if (local_e8 == '\x01') {
          local_98.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len =
               local_118._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_len;
          local_98.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_str =
               local_118._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_str;
          local_98.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          .
          super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len =
               local_118._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_len;
          local_98.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          .
          super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_str =
               local_118._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_str;
          local_98.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          .
          super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
          super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len =
               local_118._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
               super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_len;
          local_98.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          .
          super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
          super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_str =
               local_118._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
               super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_str;
          TemplateMatcher::setAsUsed(this_00,&local_98);
          std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~_Rb_tree(&local_e0);
          goto LAB_0023f867;
        }
      }
    }
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree(&local_e0);
    pCVar4 = pCVar4 + 1;
  } while( true );
}

Assistant:

bool Connector::makePotentialTemplateConnection(
    std::string_view interface,
    const std::vector<std::size_t>& tagList,
    std::vector<TemplateMatcher>& potentialTemplates,
    const std::unordered_multimap<std::string_view, std::string_view>& aliases)
{
    auto connectionOptions = buildPossibleConnectionList(interface, tagList);
    for (const auto& option : connectionOptions) {
        for (auto& matcher : potentialTemplates) {
            auto match = matcher.isTemplateMatch(option.interface2);
            if (match) {
                matcher.setAsUsed(*match);
                return true;
            }
        }
        auto aliasList = generateAliases(option.interface2, aliases);
        for (const auto& alias : aliasList) {
            for (auto& matcher : potentialTemplates) {
                auto match = matcher.isTemplateMatch(alias);
                if (match) {
                    matcher.setAsUsed(*match);
                    return true;
                }
            }
        }
    }
    return false;
}